

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::script_CHECKMULTISIG23::test_method(script_CHECKMULTISIG23 *this)

{
  uint uVar1;
  uint uVar2;
  pointer pCVar3;
  pointer pCVar4;
  readonly_property<bool> rVar5;
  bool bVar6;
  CScript *pCVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  pointer *__ptr;
  pointer pCVar8;
  SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *pSVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  vector<CKey,_std::allocator<CKey>_> keys;
  ScriptError err;
  CTransaction txFrom23;
  CMutableTransaction txTo23;
  check_type cVar13;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  assertion_result local_680;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  vector<CKey,_std::allocator<CKey>_> local_348;
  undefined1 local_330 [8];
  secure_unique_ptr<KeyType> local_328;
  undefined1 local_320 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_318;
  undefined1 local_310 [8];
  secure_unique_ptr<KeyType> local_308;
  undefined1 local_300 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_2f8;
  ScriptError local_2ec;
  undefined1 local_2e8 [16];
  shared_count asStack_2d8 [2];
  undefined1 local_2c8 [16];
  shared_count asStack_2b8 [2];
  undefined1 local_2a8 [16];
  shared_count asStack_298 [2];
  undefined1 local_288 [16];
  shared_count asStack_278 [2];
  undefined1 local_268 [16];
  shared_count asStack_258 [2];
  undefined1 local_248 [16];
  shared_count asStack_238 [2];
  undefined1 local_228 [16];
  shared_count asStack_218 [2];
  undefined1 local_208 [16];
  shared_count asStack_1f8 [2];
  undefined1 local_1e8 [16];
  _func_int *local_1d8 [2];
  undefined1 local_1c8 [24];
  vector<CTxOut,_std::allocator<CTxOut>_> avStack_1b0 [4];
  direct_or_indirect local_148;
  uint local_12c;
  CTransaction local_120;
  undefined1 local_a0 [72];
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(false);
  GenerateRandomKey(SUB81(local_310,0));
  GenerateRandomKey(SUB81(local_320,0));
  GenerateRandomKey(SUB81(local_330,0));
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = (pointer)0x0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = 0;
  local_120.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
             (uchar *)&local_120);
  CKey::GetPubKey((CPubKey *)&local_120,(CKey *)local_300);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148.indirect_contents,
             (CPubKey *)&local_120);
  b._M_extent._M_extent_value = local_148._8_8_ - local_148._0_8_;
  b._M_ptr = (pointer)local_148.indirect_contents.indirect;
  pCVar7 = CScript::operator<<((CScript *)local_58,b);
  CKey::GetPubKey((CPubKey *)local_1c8,(CKey *)local_310);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,(CPubKey *)local_1c8
            );
  b_00._M_extent._M_extent_value = CONCAT71(local_1e8._9_7_,local_1e8[8]) - local_1e8._0_8_;
  b_00._M_ptr = (pointer)local_1e8._0_8_;
  pCVar7 = CScript::operator<<(pCVar7,b_00);
  CKey::GetPubKey((CPubKey *)local_a0,(CKey *)local_320);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208,(CPubKey *)local_a0)
  ;
  b_01._M_extent._M_extent_value = local_208._8_8_ - local_208._0_8_;
  b_01._M_ptr = (pointer)local_208._0_8_;
  this_00 = &CScript::operator<<(pCVar7,b_01)->super_CScriptBase;
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar10 = this_00;
  }
  local_228[0] = (class_property<bool>)0x53;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar10->_union + (long)(int)uVar2),local_228);
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar10 = this_00;
  }
  local_228[0] = (readonly_property<bool>)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar10->_union + (long)(int)uVar2),local_228);
  if ((_func_int **)local_208._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_208._0_8_,(long)asStack_1f8[0].pi_ - local_208._0_8_);
  }
  if ((_func_int **)local_1e8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8[0] - local_1e8._0_8_);
  }
  if ((pointer)local_148.indirect_contents.indirect != (pointer)0x0) {
    operator_delete(local_148.indirect_contents.indirect,local_148._16_8_ - local_148._0_8_);
  }
  BuildCreditingTransaction((CMutableTransaction *)local_1c8,(CScript *)local_58,0);
  CTransaction::CTransaction(&local_120,(CMutableTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_148.indirect_contents.indirect = (char *)0x0;
  local_148._8_8_ = 0;
  local_148._16_8_ = 0;
  BuildSpendingTransaction
            ((CMutableTransaction *)local_a0,(CScript *)local_1c8,
             (CScriptWitness *)&local_148.indirect_contents,&local_120);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_148.indirect_contents);
  if (0x1c < avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_) {
    free((void *)local_1c8._0_8_);
  }
  local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_300);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)&local_148.indirect_contents,(CScript *)local_58,&local_348,
                (CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x43a;
  file.m_begin = (iterator)&local_358;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_368,msg);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript((CScript *)&local_148.indirect_contents,(CScript *)local_58,
                    (CScriptWitness *)0x0,3,(BaseSignatureChecker *)local_1c8,&local_2ec);
  local_208._8_8_ = (element_type *)0x0;
  asStack_1f8[0].pi_ = (sp_counted_base *)0x0;
  local_228._0_8_ =
       "VerifyScript(goodsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_228._8_8_ = "";
  local_1e8[8] = false;
  local_1e8._0_8_ = &PTR__lazy_ostream_01389048;
  local_1d8[0] = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_370 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_1d8[1] = (_func_int *)local_228;
  local_208[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)local_1e8,1,0,WARN,_cVar13,
             (size_t)&local_378,0x43a);
  boost::detail::shared_count::~shared_count(asStack_1f8);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x43b;
  file_00.m_begin = (iterator)&local_388;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_398,
             msg_00);
  local_208[0] = local_2ec == SCRIPT_ERR_OK;
  local_208._8_8_ = (element_type *)0x0;
  asStack_1f8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_1e8,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3a0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_208,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_3a8,0x43b);
  if ((_func_int **)local_1e8._0_8_ != local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)((long)local_1d8[0] + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_1f8);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_300);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_320);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_1e8,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x440;
  file_01.m_begin = (iterator)&local_3b8;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_3c8,
             msg_01);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript((CScript *)local_1e8,(CScript *)local_58,(CScriptWitness *)0x0,3,
                    (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_228._8_8_ = (element_type *)0x0;
  asStack_218[0].pi_ = (sp_counted_base *)0x0;
  asStack_1f8[1].pi_ = (sp_counted_base *)local_248;
  local_248._0_8_ =
       "VerifyScript(goodsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_248._8_8_ = "";
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_1f8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3d0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_228[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_208,1,0,WARN,_cVar13,
             (size_t)&local_3d8,0x440);
  boost::detail::shared_count::~shared_count(asStack_218);
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x441;
  file_02.m_begin = (iterator)&local_3e8;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3f8,
             msg_02);
  local_228[0] = local_2ec == SCRIPT_ERR_OK;
  local_228._8_8_ = (element_type *)0x0;
  asStack_218[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_208,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_400 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_228,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_408,0x441);
  if ((shared_count *)local_208._0_8_ != asStack_1f8) {
    operator_delete((void *)local_208._0_8_,(ulong)((long)asStack_1f8[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_218);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_320);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_208,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x446;
  file_03.m_begin = (iterator)&local_418;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_428,
             msg_03);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  rVar5.super_class_property<bool>.value =
       (class_property<bool>)
       VerifyScript((CScript *)local_208,(CScript *)local_58,(CScriptWitness *)0x0,3,
                    (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_248._8_8_ = (element_type *)0x0;
  asStack_238[0].pi_ = (sp_counted_base *)0x0;
  asStack_218[1].pi_ = (sp_counted_base *)local_268;
  local_268._0_8_ =
       "VerifyScript(goodsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_268._8_8_ = "";
  local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
  local_228._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_218[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_430 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_248[0] = rVar5.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_248,(lazy_ostream *)local_228,1,0,WARN,_cVar13,
             (size_t)&local_438,0x446);
  boost::detail::shared_count::~shared_count(asStack_238);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x447;
  file_04.m_begin = (iterator)&local_448;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_458,
             msg_04);
  local_248[0] = local_2ec == SCRIPT_ERR_OK;
  local_248._8_8_ = (element_type *)0x0;
  asStack_238[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_228,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_460 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_248,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_468,0x447);
  if ((shared_count *)local_228._0_8_ != asStack_218) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)asStack_218[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_238);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_228,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x44c;
  file_05.m_begin = (iterator)&local_478;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_488,
             msg_05);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  bVar6 = VerifyScript((CScript *)local_228,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_268._8_8_ = (element_type *)0x0;
  asStack_258[0].pi_ = (sp_counted_base *)0x0;
  asStack_238[1].pi_ = (sp_counted_base *)local_288;
  local_288._0_8_ =
       "!VerifyScript(badsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_288._8_8_ = "";
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_238[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_490 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_268[0] = !bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_268,(lazy_ostream *)local_248,1,0,WARN,_cVar13,
             (size_t)&local_498,0x44c);
  boost::detail::shared_count::~shared_count(asStack_258);
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x44d;
  file_06.m_begin = (iterator)&local_4a8;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_4b8,
             msg_06);
  local_268[0] = local_2ec == SCRIPT_ERR_EVAL_FALSE;
  local_268._8_8_ = (element_type *)0x0;
  asStack_258[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_248,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4c0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_268,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_4c8,0x44d);
  if ((shared_count *)local_248._0_8_ != asStack_238) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)asStack_238[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_258);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_300);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_248,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x452;
  file_07.m_begin = (iterator)&local_4d8;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4e8,
             msg_07);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  bVar6 = VerifyScript((CScript *)local_248,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_288._8_8_ = (element_type *)0x0;
  asStack_278[0].pi_ = (sp_counted_base *)0x0;
  asStack_258[1].pi_ = (sp_counted_base *)local_2a8;
  local_2a8._0_8_ =
       "!VerifyScript(badsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_2a8._8_8_ = "";
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_258[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_4f0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_288[0] = !bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_288,(lazy_ostream *)local_268,1,0,WARN,_cVar13,
             (size_t)&local_4f8,0x452);
  boost::detail::shared_count::~shared_count(asStack_278);
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x453;
  file_08.m_begin = (iterator)&local_508;
  msg_08.m_end = pvVar12;
  msg_08.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_518,
             msg_08);
  local_288[0] = local_2ec == SCRIPT_ERR_EVAL_FALSE;
  local_288._8_8_ = (element_type *)0x0;
  asStack_278[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_268,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_520 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_268;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_288,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_528,0x453);
  if ((shared_count *)local_268._0_8_ != asStack_258) {
    operator_delete((void *)local_268._0_8_,(ulong)((long)asStack_258[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_278);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_320);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_268,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x458;
  file_09.m_begin = (iterator)&local_538;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_548,
             msg_09);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  bVar6 = VerifyScript((CScript *)local_268,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_2a8._8_8_ = (element_type *)0x0;
  asStack_298[0].pi_ = (sp_counted_base *)0x0;
  asStack_278[1].pi_ = (sp_counted_base *)local_2c8;
  local_2c8._0_8_ =
       "!VerifyScript(badsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_2c8._8_8_ = "";
  local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
  local_288._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_278[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_550 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_2a8[0] = !bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2a8,(lazy_ostream *)local_288,1,0,WARN,_cVar13,
             (size_t)&local_558,0x458);
  boost::detail::shared_count::~shared_count(asStack_298);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x459;
  file_10.m_begin = (iterator)&local_568;
  msg_10.m_end = pvVar12;
  msg_10.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_578,
             msg_10);
  local_2a8[0] = local_2ec == SCRIPT_ERR_EVAL_FALSE;
  local_2a8._8_8_ = (element_type *)0x0;
  asStack_298[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_288,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_580 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_288;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2a8,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_588,0x459);
  if ((shared_count *)local_288._0_8_ != asStack_278) {
    operator_delete((void *)local_288._0_8_,(ulong)((long)asStack_278[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_298);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_330);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_310);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_288,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x45e;
  file_11.m_begin = (iterator)&local_598;
  msg_11.m_end = pvVar12;
  msg_11.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5a8,
             msg_11);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  bVar6 = VerifyScript((CScript *)local_288,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_2c8._8_8_ = (element_type *)0x0;
  asStack_2b8[0].pi_ = (sp_counted_base *)0x0;
  asStack_298[1].pi_ = (sp_counted_base *)local_2e8;
  local_2e8._0_8_ =
       "!VerifyScript(badsig4, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_2e8._8_8_ = "";
  local_2a8._8_8_ = local_2a8._8_8_ & 0xffffffffffffff00;
  local_2a8._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_298[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5b0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_2c8[0] = !bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c8,(lazy_ostream *)local_2a8,1,0,WARN,_cVar13,
             (size_t)&local_5b8,0x45e);
  boost::detail::shared_count::~shared_count(asStack_2b8);
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x45f;
  file_12.m_begin = (iterator)&local_5c8;
  msg_12.m_end = pvVar12;
  msg_12.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_5d8,
             msg_12);
  local_2c8[0] = local_2ec == SCRIPT_ERR_EVAL_FALSE;
  local_2c8._8_8_ = (element_type *)0x0;
  asStack_2b8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_2a8,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5e0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_2a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2c8,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_5e8,0x45f);
  if ((shared_count *)local_2a8._0_8_ != asStack_298) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)asStack_298[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_2b8);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_300);
  std::vector<CKey,_std::allocator<CKey>_>::push_back(&local_348,(value_type *)local_330);
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_2a8,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x464;
  file_13.m_begin = (iterator)&local_5f8;
  msg_13.m_end = pvVar12;
  msg_13.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_608,
             msg_13);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  bVar6 = VerifyScript((CScript *)local_2a8,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_2e8._8_8_ = (element_type *)0x0;
  asStack_2d8[0].pi_ = (sp_counted_base *)0x0;
  asStack_2b8[1].pi_ = (sp_counted_base *)&local_680;
  local_680._0_8_ =
       "!VerifyScript(badsig5, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_680.m_message.px = (element_type *)0xeaf2bb;
  local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
  local_2c8._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_2b8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_610 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_2e8[0] = (class_property<bool>)(class_property<bool>)!bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2e8,(lazy_ostream *)local_2c8,1,0,WARN,_cVar13,
             (size_t)&local_618,0x464);
  boost::detail::shared_count::~shared_count(asStack_2d8);
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x465;
  file_14.m_begin = (iterator)&local_628;
  msg_14.m_end = pvVar12;
  msg_14.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_638,
             msg_14);
  local_2e8[0] = (class_property<bool>)(class_property<bool>)(local_2ec == SCRIPT_ERR_EVAL_FALSE);
  local_2e8._8_8_ = (element_type *)0x0;
  asStack_2d8[0].pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_2c8,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_640 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x1;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_2c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_2e8,(lazy_ostream *)local_1c8,1,1,WARN,_cVar13,
             (size_t)&local_648,0x465);
  if ((shared_count *)local_2c8._0_8_ != asStack_2b8) {
    operator_delete((void *)local_2c8._0_8_,(ulong)((long)asStack_2b8[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(asStack_2d8);
  pCVar4 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pCVar3 = local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    pSVar9 = (SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
             &(local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
               super__Vector_impl_data._M_start)->keydata;
    do {
      if (*(array<unsigned_char,_32UL> **)pSVar9 != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  (pSVar9,*(array<unsigned_char,_32UL> **)pSVar9);
      }
      *(undefined8 *)pSVar9 = 0;
      pCVar8 = (pointer)(pSVar9 + 8);
      pSVar9 = pSVar9 + 0x10;
    } while (pCVar8 != pCVar4);
    local_348.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data.
    _M_finish = pCVar3;
  }
  CTransaction::CTransaction((CTransaction *)local_1c8,(CMutableTransaction *)local_a0);
  sign_multisig((CScript *)local_2c8,(CScript *)local_58,&local_348,(CTransaction *)local_1c8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(avStack_1b0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_1c8);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_650 = "";
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x469;
  file_15.m_begin = (iterator)&local_658;
  msg_15.m_end = pvVar12;
  msg_15.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_668,
             msg_15);
  local_1c8._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_1c8._16_8_ = (pointer)0x0;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)(local_120.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start)->nValue;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_1c8._8_8_ = (pointer)local_a0;
  bVar6 = VerifyScript((CScript *)local_2c8,(CScript *)local_58,(CScriptWitness *)0x0,3,
                       (BaseSignatureChecker *)local_1c8,&local_2ec);
  local_680.m_message.px = (element_type *)0x0;
  local_680.m_message.pn.pi_ = (sp_counted_base *)0x0;
  asStack_2d8[1].pi_ = (sp_counted_base *)&local_690;
  local_690 = 
  "!VerifyScript(badsig6, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err)"
  ;
  local_688 = "";
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_2e8._0_8_ = &PTR__lazy_ostream_01389048;
  asStack_2d8[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_698 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_680.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_680,(lazy_ostream *)local_2e8,1,0,WARN,_cVar13,(size_t)&local_6a0,0x469);
  boost::detail::shared_count::~shared_count(&local_680.m_message.pn);
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x46a;
  file_16.m_begin = (iterator)&local_6b0;
  msg_16.m_end = pvVar12;
  msg_16.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_6c0,
             msg_16);
  local_680.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_2ec == SCRIPT_ERR_INVALID_STACK_OPERATION);
  local_680.m_message.px = (element_type *)0x0;
  local_680.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_2e8,local_2ec);
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_01388e08;
  local_1c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  avStack_1b0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_680,(lazy_ostream *)local_1c8,1,1,WARN,0xead230,(size_t)&stack0xfffffffffffff930
             ,0x46a);
  if ((shared_count *)local_2e8._0_8_ != asStack_2d8) {
    operator_delete((void *)local_2e8._0_8_,(ulong)((long)asStack_2d8[0].pi_ + 1));
  }
  boost::detail::shared_count::~shared_count(&local_680.m_message.pn);
  if (0x1c < (uint)asStack_2b8[1].pi_._4_4_) {
    free((void *)local_2c8._0_8_);
  }
  if (0x1c < (uint)asStack_298[1].pi_._4_4_) {
    free((void *)local_2a8._0_8_);
  }
  if (0x1c < (uint)asStack_278[1].pi_._4_4_) {
    free((void *)local_288._0_8_);
  }
  if (0x1c < (uint)asStack_258[1].pi_._4_4_) {
    free((void *)local_268._0_8_);
  }
  if (0x1c < (uint)asStack_238[1].pi_._4_4_) {
    free((void *)local_248._0_8_);
  }
  if (0x1c < (uint)asStack_218[1].pi_._4_4_) {
    free((void *)local_228._0_8_);
  }
  if (0x1c < (uint)asStack_1f8[1].pi_._4_4_) {
    free((void *)local_208._0_8_);
  }
  if (0x1c < (uint)local_1d8[1]._4_4_) {
    free((void *)local_1e8._0_8_);
  }
  if (0x1c < local_12c) {
    free(local_148.indirect_contents.indirect);
  }
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&local_348);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_a0 + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_a0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_120.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_120.vin);
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
  }
  if (local_328._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_328,
               (array<unsigned_char,_32UL> *)
               local_328._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (local_318._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_318,
               local_318._M_head_impl);
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_308._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_308,
               (array<unsigned_char,_32UL> *)
               local_308._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_2f8._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_2f8,
               (array<unsigned_char,_32UL> *)
               local_2f8._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_CHECKMULTISIG23)
{
    ScriptError err;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey(/*compressed=*/false);
    CKey key3 = GenerateRandomKey();
    CKey key4 = GenerateRandomKey(/*compressed=*/false);

    CScript scriptPubKey23;
    scriptPubKey23 << OP_2 << ToByteVector(key1.GetPubKey()) << ToByteVector(key2.GetPubKey()) << ToByteVector(key3.GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    const CTransaction txFrom23{BuildCreditingTransaction(scriptPubKey23)};
    CMutableTransaction txTo23 = BuildSpendingTransaction(CScript(), CScriptWitness(), txFrom23);

    std::vector<CKey> keys;
    keys.push_back(key1); keys.push_back(key2);
    CScript goodsig1 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key1); keys.push_back(key3);
    CScript goodsig2 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key3);
    CScript goodsig3 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(VerifyScript(goodsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key2); // Can't reuse sig
    CScript badsig1 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig1, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key2); keys.push_back(key1); // sigs must be in correct order
    CScript badsig2 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig2, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key3); keys.push_back(key2); // sigs must be in correct order
    CScript badsig3 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig3, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key4); keys.push_back(key2); // sigs must match pubkeys
    CScript badsig4 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig4, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear();
    keys.push_back(key1); keys.push_back(key4); // sigs must match pubkeys
    CScript badsig5 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig5, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    keys.clear(); // Must have signatures
    CScript badsig6 = sign_multisig(scriptPubKey23, keys, CTransaction(txTo23));
    BOOST_CHECK(!VerifyScript(badsig6, scriptPubKey23, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo23, 0, txFrom23.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_INVALID_STACK_OPERATION, ScriptErrorString(err));
}